

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClausesBuffer.cc
# Opt level: O0

bool __thiscall Glucose::ClausesBuffer::pushClause(ClausesBuffer *this,int threadId,Clause *c)

{
  uint uVar1;
  int iVar2;
  Lit *pLVar3;
  Clause *in_RDX;
  ClausesBuffer *in_RDI;
  int i;
  uint32_t in_stack_ffffffffffffffcc;
  int local_24;
  
  if ((in_RDI->whenFullRemoveOlder & 1U) == 0) {
    in_stack_ffffffffffffffcc = in_RDI->queuesize;
    iVar2 = Clause::size(in_RDX);
    if (in_RDI->maxsize <= in_stack_ffffffffffffffcc + iVar2 + 3) {
      return false;
    }
  }
  while (uVar1 = in_RDI->queuesize, iVar2 = Clause::size(in_RDX),
        in_RDI->maxsize <= uVar1 + iVar2 + 3) {
    in_RDI->forcedRemovedClauses = in_RDI->forcedRemovedClauses + 1;
    removeLastClause(in_RDI);
  }
  Clause::size(in_RDX);
  noCheckPush(in_RDI,in_stack_ffffffffffffffcc);
  noCheckPush(in_RDI,in_stack_ffffffffffffffcc);
  noCheckPush(in_RDI,in_stack_ffffffffffffffcc);
  for (local_24 = 0; iVar2 = Clause::size(in_RDX), local_24 < iVar2; local_24 = local_24 + 1) {
    pLVar3 = Clause::operator[](in_RDX,local_24);
    toInt(in_RDI,(Lit)pLVar3->x);
    noCheckPush(in_RDI,in_stack_ffffffffffffffcc);
  }
  iVar2 = Clause::size(in_RDX);
  in_RDI->queuesize = iVar2 + 3 + in_RDI->queuesize;
  return true;
}

Assistant:

bool ClausesBuffer::pushClause(int threadId, Clause & c) {
    if (!whenFullRemoveOlder && (queuesize + c.size() + headerSize >= maxsize))
	return false; // We need to remove some old clauses
    while (queuesize + c.size() + headerSize >= maxsize) { // We need to remove some old clauses
	forcedRemovedClauses ++;
	removeLastClause();
	assert(queuesize > 0);
    }
    noCheckPush(c.size());
    noCheckPush(nbThreads>1?nbThreads-1:1);
    noCheckPush(threadId);
    for(int i=0;i<c.size();i++)
	noCheckPush(toInt(c[i]));
    queuesize += c.size()+headerSize;
    return true;
    //  printf(" -> (%d, %d)\n", first, last);
}